

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_cv_test.cpp
# Opt level: O0

void showUsage(void)

{
  ostream *this;
  
  this = std::operator<<((ostream *)&std::cout,"Usage: ");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"[-gr set gray color capture]\n");
  std::operator<<((ostream *)&std::cout,
                  "[-test_speed use for test speed and no images will be saved]\n");
  std::operator<<((ostream *)&std::cout,"[-w width] [-h height] \n[-br brightness_val(0,100)]\n");
  std::operator<<((ostream *)&std::cout,
                  "[-co contrast_val (0 to 100)]\n[-sa saturation_val (0 to 100)]");
  std::operator<<((ostream *)&std::cout,"[-g gain_val  (0 to 100)]\n");
  std::operator<<((ostream *)&std::cout,"[-ss shutter_speed (0 to 100) 0 auto]\n");
  std::operator<<((ostream *)&std::cout,
                  "[-wb_r val  (0 to 100),0 auto: white balance red component]\n");
  std::operator<<((ostream *)&std::cout,
                  "[-wb_b val  (0 to 100),0 auto: white balance blue component]\n");
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void showUsage() {
    cout<<"Usage: "<<endl;
    cout<<"[-gr set gray color capture]\n";
    cout<<"[-test_speed use for test speed and no images will be saved]\n";
    cout<<"[-w width] [-h height] \n[-br brightness_val(0,100)]\n";
    cout<<"[-co contrast_val (0 to 100)]\n[-sa saturation_val (0 to 100)]";
    cout<<"[-g gain_val  (0 to 100)]\n";
    cout<<"[-ss shutter_speed (0 to 100) 0 auto]\n";
    cout<<"[-wb_r val  (0 to 100),0 auto: white balance red component]\n";
    cout<<"[-wb_b val  (0 to 100),0 auto: white balance blue component]\n";

    cout<<endl;
}